

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

double __thiscall QStringView::toDouble(QStringView *this,bool *ok)

{
  size_t sVar1;
  uchar *dst;
  size_t allocSize;
  long in_FS_OFFSET;
  QStringView QVar2;
  QSimpleParsedNumber<double> QVar3;
  storage_type_conflict *in_stack_fffffffffffffea8;
  size_t local_148;
  uchar local_130 [256];
  long local_30;
  size_t allocSize_00;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2.m_data = in_stack_fffffffffffffea8;
  QVar2.m_size = 0x32dc09;
  QVar2 = anon_unknown.dwarf_cb1ed3::qt_trimmed<QStringView>(QVar2);
  allocSize_00 = QVar2.m_size;
  memset(local_130,0xaa,0x100);
  local_148 = 0x100;
  dst = local_130;
  if (0x100 < (long)allocSize_00) {
    sVar1 = QtPrivate::expectedAllocSize(allocSize_00,0x10);
    local_148 = allocSize_00;
    if (sVar1 != 0) {
      local_148 = sVar1;
    }
    dst = (uchar *)malloc(local_148);
    if (dst == (uchar *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
      goto LAB_0032dd3f;
    }
  }
  qt_to_latin1(dst,QVar2.m_data,allocSize_00);
  QVar3 = qt_asciiToDouble((char *)dst,allocSize_00,TrailingJunkProhibited);
  if (ok != (bool *)0x0) {
    *ok = 0 < QVar3.used;
  }
  if (dst != local_130) {
    QtPrivate::sizedFree(dst,local_148);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return QVar3.result;
  }
LAB_0032dd3f:
  __stack_chk_fail();
}

Assistant:

double QStringView::toDouble(bool *ok) const
{
    QStringView string = qt_trimmed(*this);
    QVarLengthArray<uchar> latin1(string.size());
    qt_to_latin1(latin1.data(), string.utf16(), string.size());
    auto r = qt_asciiToDouble(reinterpret_cast<const char *>(latin1.data()), string.size());
    if (ok != nullptr)
        *ok = r.ok();
    return r.result;
}